

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O2

void streamMetaInformationCb(StreamClient *stream,string *method,Value *params)

{
  bool bVar1;
  UInt UVar2;
  ostream *poVar3;
  Value *pVVar4;
  size_t in_RCX;
  undefined1 auVar5 [8];
  const_iterator cVar6;
  signalReferences_t signalReferences;
  undefined1 local_88 [8];
  _Alloc_hider _Stack_80;
  pointer local_78;
  undefined1 local_68 [48];
  ValueIteratorBase local_38;
  
  poVar3 = std::operator<<((ostream *)streamMetaFile,(string *)method);
  poVar3 = std::operator<<(poVar3,": ");
  Json::FastWriter::FastWriter((FastWriter *)local_68);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_88,(int)(FastWriter *)local_68,params,in_RCX);
  poVar3 = std::operator<<(poVar3,(string *)local_88);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)local_88);
  Json::FastWriter::~FastWriter((FastWriter *)local_68);
  bVar1 = std::operator==(method,"available");
  if (bVar1) {
    local_88 = (undefined1  [8])0x0;
    _Stack_80._M_p = (pointer)0x0;
    local_78 = (pointer)0x0;
    cVar6 = Json::Value::begin(params);
    local_38.current_ = cVar6.super_ValueIteratorBase.current_._M_node;
    local_38.isNull_ = cVar6.super_ValueIteratorBase.isNull_;
    while( true ) {
      cVar6 = Json::Value::end(params);
      local_68._0_8_ = cVar6.super_ValueIteratorBase.current_._M_node;
      local_68[8] = cVar6.super_ValueIteratorBase.isNull_;
      bVar1 = Json::ValueIteratorBase::operator!=(&local_38,(SelfType *)local_68);
      if (!bVar1) break;
      pVVar4 = Json::ValueIteratorBase::deref(&local_38);
      Json::Value::asString_abi_cxx11_((string *)local_68,pVVar4);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88,
                 (string *)local_68);
      std::__cxx11::string::~string((string *)local_68);
      Json::ValueIteratorBase::increment(&local_38);
    }
    hbm::streaming::StreamClient::subscribe(stream,(signalReferences_t *)local_88);
    poVar3 = std::operator<<((ostream *)&std::cout,"The following ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," signal(s) were subscribed: ");
    for (auVar5 = local_88; auVar5 != (undefined1  [8])_Stack_80._M_p;
        auVar5 = (undefined1  [8])((long)auVar5 + 0x20)) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\'");
      poVar3 = std::operator<<(poVar3,(string *)auVar5);
      std::operator<<(poVar3,"\' ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
  }
  else {
    bVar1 = std::operator==(method,"unavailable");
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"streamMetaInformationCb");
      std::operator<<(poVar3," the following signal(s) is(are) not available anymore: ");
      cVar6 = Json::Value::begin(params);
      local_88 = (undefined1  [8])cVar6.super_ValueIteratorBase.current_._M_node;
      _Stack_80._M_p._0_1_ = cVar6.super_ValueIteratorBase.isNull_;
      while( true ) {
        cVar6 = Json::Value::end(params);
        local_68._0_8_ = cVar6.super_ValueIteratorBase.current_._M_node;
        local_68[8] = cVar6.super_ValueIteratorBase.isNull_;
        bVar1 = Json::ValueIteratorBase::operator!=
                          ((ValueIteratorBase *)local_88,(SelfType *)local_68);
        if (!bVar1) break;
        pVVar4 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_88);
        Json::Value::asString_abi_cxx11_((string *)local_68,pVVar4);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_68);
        std::operator<<(poVar3,", ");
        std::__cxx11::string::~string((string *)local_68);
        Json::ValueIteratorBase::increment((ValueIteratorBase *)local_88);
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
    else {
      bVar1 = std::operator==(method,"alive");
      if (!bVar1) {
        bVar1 = std::operator==(method,"fill");
        if (bVar1) {
          bVar1 = Json::Value::empty(params);
          if (!bVar1) {
            pVVar4 = Json::Value::operator[](params,0);
            UVar2 = Json::Value::asUInt(pVVar4);
            if (0x19 < UVar2) {
              std::__cxx11::string::string((string *)local_68,(string *)&stream->m_address);
              poVar3 = std::operator<<((ostream *)&std::cout,(string *)local_68);
              poVar3 = std::operator<<(poVar3,": ring buffer fill level is ");
              pVVar4 = Json::Value::operator[](params,0);
              Json::Value::asUInt(pVVar4);
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              poVar3 = std::operator<<(poVar3,"%");
              std::endl<char,std::char_traits<char>>(poVar3);
              std::__cxx11::string::~string((string *)local_68);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void streamMetaInformationCb(hbm::streaming::StreamClient& stream, const std::string& method, const Json::Value& params)
{
	streamMetaFile << method << ": " << Json::FastWriter().write(params) << std::endl;
	if (method == hbm::streaming::META_METHOD_AVAILABLE) {
		// simply subscibe all signals that become available.
		hbm::streaming::signalReferences_t signalReferences;
		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			signalReferences.push_back(element.asString());
		}

		try {
			stream.subscribe(signalReferences);
			std::cout << "The following " << signalReferences.size() << " signal(s) were subscribed: ";
			for(hbm::streaming::signalReferences_t::const_iterator iter=signalReferences.begin(); iter!=signalReferences.end(); ++iter) {
				std::cout << "'" << *iter << "' ";
			}
			std::cout << std::endl;
		} catch(const std::runtime_error& e) {
			std::cerr << __FUNCTION__ << " error '" << e.what() << "' subscribing the following signal(s): ";
		}
	} else if(method==hbm::streaming::META_METHOD_UNAVAILABLE) {
		std::cout << __FUNCTION__ << " the following signal(s) is(are) not available anymore: ";

		for (Json::ValueConstIterator iter = params.begin(); iter!= params.end(); ++iter) {
			const Json::Value& element = *iter;
			std::cout << element.asString() << ", ";
		}
		std::cout << std::endl;
	} else if(method==hbm::streaming::META_METHOD_ALIVE) {
		// We do ignore this. We are using TCP keep alive in order to detect communication problems.
	} else if(method==hbm::streaming::META_METHOD_FILL) {
		if(params.empty()==false) {
			unsigned int fill = params[0u].asUInt();
			if(fill>25) {
				std::cout << stream.address() << ": ring buffer fill level is " << params[0u].asUInt() << "%" << std::endl;
			}
		}
	}
}